

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_align.c
# Opt level: O0

void align_sen_active(uint8 *senlist,int32 n_sen)

{
  int local_1c;
  int local_18;
  int32 sen;
  int32 i;
  int32 n_sen_local;
  uint8 *senlist_local;
  
  for (local_1c = 0; local_1c < n_sen; local_1c = local_1c + 1) {
    senlist[local_1c] = '\0';
  }
  local_18 = 0;
  while( true ) {
    if (cur_active[local_18] == (snode_t *)0x0) {
      return;
    }
    if (cur_active[local_18]->sen < 0) break;
    senlist[cur_active[local_18]->sen] = '\x01';
    local_18 = local_18 + 1;
  }
  __assert_fail("IS_S3SENID(cur_active[i]->sen)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/s3_align.c"
                ,0x3f6,"void align_sen_active(uint8 *, int32)");
}

Assistant:

void
align_sen_active(uint8 * senlist, int32 n_sen)
{
    int32 i, sen;

    for (sen = 0; sen < n_sen; sen++)
        senlist[sen] = 0;

    for (i = 0; cur_active[i]; i++) {
        assert(IS_S3SENID(cur_active[i]->sen));
        senlist[cur_active[i]->sen] = 1;
    }
}